

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drive-test.cpp
# Opt level: O0

void __thiscall control::terminate_on_key(control *this)

{
  type *in_RDI;
  thread *unaff_retaddr;
  thread t;
  
  std::thread::thread<control::terminate_on_key()::__0,,void>(unaff_retaddr,in_RDI);
  std::thread::detach();
  std::thread::~thread((thread *)0x123e4d);
  return;
}

Assistant:

void control::terminate_on_key()
{
 #ifndef NO_LINUX_HEADERS
  thread t([&] () {
    int fd = open("/dev/input/by-path/platform-gpio-keys.0-event", O_RDONLY);
    if (fd  < 0)
    {
      cout << "Couldn't open platform-gpio-keys device!" << endl;
      return;
    }

    input_event ev;
    while (true)
    {
      size_t rb = read(fd, &ev, sizeof(ev));

      if (rb < sizeof(input_event))
        continue;

      if ((ev.type == EV_KEY) /*&& (ev.value == KEY_PRESS)*/)
      {
        terminate();
        return;
      }
    }
  });
  t.detach();
 #endif
}